

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O0

char * fy_token_debug_text(fy_token *fyt)

{
  int iVar1;
  char *pcVar2;
  ulong local_48;
  int rc;
  int wlen;
  size_t length;
  char *buf;
  char *text;
  char *typetxt;
  fy_token *fyt_local;
  
  typetxt = (char *)fyt;
  if (fyt == (fy_token *)0x0) {
    text = "<NULL>";
  }
  else {
    switch(fyt->type) {
    case FYTT_NONE:
      text = (char *)0x0;
      break;
    case FYTT_STREAM_START:
      text = "STRM+";
      break;
    case FYTT_STREAM_END:
      text = "STRM-";
      break;
    case FYTT_VERSION_DIRECTIVE:
      text = "VRSD";
      break;
    case FYTT_TAG_DIRECTIVE:
      text = "TAGD";
      break;
    case FYTT_DOCUMENT_START:
      text = "DOC+";
      break;
    case FYTT_DOCUMENT_END:
      text = "DOC-";
      break;
    case FYTT_BLOCK_SEQUENCE_START:
      text = "BSEQ+";
      break;
    case FYTT_BLOCK_MAPPING_START:
      text = "BMAP+";
      break;
    case FYTT_BLOCK_END:
      text = "BEND";
      break;
    case FYTT_FLOW_SEQUENCE_START:
      text = "FSEQ+";
      break;
    case FYTT_FLOW_SEQUENCE_END:
      text = "FSEQ-";
      break;
    case FYTT_FLOW_MAPPING_START:
      text = "FMAP+";
      break;
    case FYTT_FLOW_MAPPING_END:
      text = "FMAP-";
      break;
    case FYTT_BLOCK_ENTRY:
      text = "BENTR";
      break;
    case FYTT_FLOW_ENTRY:
      text = "FENTR";
      break;
    case FYTT_KEY:
      text = "KEY";
      break;
    case FYTT_VALUE:
      text = "VAL";
      break;
    case FYTT_ALIAS:
      text = "ALIAS";
      break;
    case FYTT_ANCHOR:
      text = "ANCHR";
      break;
    case FYTT_TAG:
      text = "TAG";
      break;
    case FYTT_SCALAR:
      text = "SCLR";
      break;
    case FYTT_INPUT_MARKER:
      text = "IMRKR";
      break;
    default:
      text = (char *)0x0;
    }
    if (text == (char *)0x0) {
      __assert_fail("typetxt",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                    ,0x3e2,"char *fy_token_debug_text(struct fy_token *)");
    }
  }
  buf = fy_token_get_text(fyt,(size_t *)&rc);
  if (_rc < 9) {
    local_48 = _rc;
  }
  else {
    local_48 = 8;
  }
  pcVar2 = "";
  if ((int)local_48 < (int)_rc) {
    pcVar2 = "...";
  }
  iVar1 = asprintf((char **)&length,"%s:%.*s%s",text,local_48 & 0xffffffff,buf,pcVar2);
  if (iVar1 == -1) {
    __assert_fail("rc != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                  ,0x3ea,"char *fy_token_debug_text(struct fy_token *)");
  }
  return (char *)length;
}

Assistant:

char *fy_token_debug_text(struct fy_token *fyt) {
    const char *typetxt;
    const char *text;
    char *buf;
    size_t length;
    int wlen;
    int rc __FY_DEBUG_UNUSED__;

    if (!fyt) {
        typetxt = "<NULL>";
        goto out;
    }

    switch (fyt->type) {
        case FYTT_NONE:
            typetxt = NULL;
            break;
        case FYTT_STREAM_START:
            typetxt = "STRM+";
            break;
        case FYTT_STREAM_END:
            typetxt = "STRM-";
            break;
        case FYTT_VERSION_DIRECTIVE:
            typetxt = "VRSD";
            break;
        case FYTT_TAG_DIRECTIVE:
            typetxt = "TAGD";
            break;
        case FYTT_DOCUMENT_START:
            typetxt = "DOC+";
            break;
        case FYTT_DOCUMENT_END:
            typetxt = "DOC-";
            break;
        case FYTT_BLOCK_SEQUENCE_START:
            typetxt = "BSEQ+";
            break;
        case FYTT_BLOCK_MAPPING_START:
            typetxt = "BMAP+";
            break;
        case FYTT_BLOCK_END:
            typetxt = "BEND";
            break;
        case FYTT_FLOW_SEQUENCE_START:
            typetxt = "FSEQ+";
            break;
        case FYTT_FLOW_SEQUENCE_END:
            typetxt = "FSEQ-";
            break;
        case FYTT_FLOW_MAPPING_START:
            typetxt = "FMAP+";
            break;
        case FYTT_FLOW_MAPPING_END:
            typetxt = "FMAP-";
            break;
        case FYTT_BLOCK_ENTRY:
            typetxt = "BENTR";
            break;
        case FYTT_FLOW_ENTRY:
            typetxt = "FENTR";
            break;
        case FYTT_KEY:
            typetxt = "KEY";
            break;
        case FYTT_SCALAR:
            typetxt = "SCLR";
            break;
        case FYTT_VALUE:
            typetxt = "VAL";
            break;
        case FYTT_ALIAS:
            typetxt = "ALIAS";
            break;
        case FYTT_ANCHOR:
            typetxt = "ANCHR";
            break;
        case FYTT_TAG:
            typetxt = "TAG";
            break;
        case FYTT_INPUT_MARKER:
            typetxt = "IMRKR";
            break;
        default:
            typetxt = NULL;
            break;
    }
    /* should never happen really */
    assert(typetxt);

    out:
    text = fy_token_get_text(fyt, &length);

    wlen = length > 8 ? 8 : length;

    rc = asprintf(&buf, "%s:%.*s%s", typetxt, wlen, text, wlen < (int) length ? "..." : "");
    assert(rc != -1);

    return buf;
}